

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall Sudoku::print(Sudoku *this)

{
  int y;
  long lVar1;
  int x;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      if (((uint)*(sudoku_policko *)((long)this + lVar2 * 4) & 0xf) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      }
      else {
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    lVar1 = lVar1 + 1;
    this = (Sudoku *)((long)this + 0x24);
  } while (lVar1 != 9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void Sudoku::print( void )
{
  for(int y=0;y<9;y++)
  {
    for(int x=0;x<9;x++)
    {
      if (s.pole[y*9+x].zapsane)
        cout<< s.pole[y*9+x].zapsane;
      else
        cout<< ".";
    } 
    cout << endl;
  }
   cout << endl;
}